

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.h
# Opt level: O2

void __thiscall cnn::Timer::~Timer(Timer *this)

{
  long lVar1;
  ostream *poVar2;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::operator<<((ostream *)&std::cerr,'[');
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::operator<<(poVar2,' ');
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (this->start).__d.__r) * 1e-06);
  std::operator<<(poVar2," ms]\n");
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Timer() {
    auto stop = std::chrono::high_resolution_clock::now();
    std::cerr << '[' << msg << ' ' << std::chrono::duration<double, std::milli>(stop-start).count() << " ms]\n";
  }